

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refinement_pattern.cc
# Opt level: O3

bool lf::geometry::isParallelogram(Matrix<int,__1,__1,_0,__1,__1> *polygon)

{
  LhsNested pMVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Scalar SVar3;
  CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *pCVar4;
  Matrix<int,_4,_1,_0,_4,_1> *rhs;
  bool bVar5;
  stringstream ss;
  scalar_sum_op<int,_int> local_219;
  undefined1 local_218 [32];
  string local_1f8;
  string local_1d0;
  Scalar local_1b0 [2];
  undefined1 local_1a8 [16];
  Index local_198;
  Index local_190;
  
  if ((polygon->super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>).m_storage.m_rows == 2
     ) {
    if ((polygon->super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
        4) {
      local_1a8._0_8_ = &local_1f8;
      local_1a8._8_8_ = 0;
      local_198 = 1;
      local_190 = 1;
      local_1f8._M_dataplus._M_p._0_4_ = 1;
      local_1d0._M_dataplus._M_p._0_4_ = 0xffffffff;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)local_1a8,
                          (Scalar *)&local_1d0);
      local_1b0[1] = 1;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::operator_
                         (pCVar4,local_1b0 + 1);
      local_1b0[0] = -1;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::operator_
                         (pCVar4,local_1b0);
      rhs = Eigen::CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::finished(pCVar4);
      Eigen::Product<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0>::
      Product((Product<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0>
               *)local_218,polygon,rhs);
      if (*(Index *)(local_218._0_8_ + 8) == 0) {
        bVar5 = true;
      }
      else {
        SVar3 = Eigen::
                DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<int>,Eigen::Product<Eigen::Matrix<int,-1,-1,0,-1,-1>,Eigen::Matrix<int,4,1,0,4,1>,0>const>>
                ::redux<Eigen::internal::scalar_sum_op<int,int>>
                          ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<int>,Eigen::Product<Eigen::Matrix<int,_1,_1,0,_1,_1>,Eigen::Matrix<int,4,1,0,4,1>,0>const>>
                            *)local_218,&local_219);
        bVar5 = SVar3 == 0;
      }
      Eigen::CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)local_1a8);
    }
    else {
      bVar5 = false;
    }
    return bVar5;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Only planar polygons supported",0x1e);
  pMVar1 = (LhsNested)(local_218 + 0x10);
  local_218._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"polygon.rows() == 2","");
  paVar2 = &local_1f8.field_2;
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/refinement_pattern.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed((string *)local_218,&local_1f8,0x14,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((LhsNested)local_218._0_8_ != pMVar1) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  local_218._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"false","");
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/refinement_pattern.cc"
             ,"");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  base::AssertionFailed((string *)local_218,&local_1f8,0x14,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)local_218);
  abort();
}

Assistant:

bool isParallelogram(
    const Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic> &polygon) {
  LF_ASSERT_MSG(polygon.rows() == 2, "Only planar polygons supported");
  // A parallelogram must have four vertices
  if (polygon.cols() != 4) {
    return false;
  }
  return ((polygon * (Eigen::Vector4i() << 1, -1, 1, -1).finished())
              .squaredNorm() == 0);
}